

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000018e010 = 0x2e2e2e2e2e2e2e;
    uRam000000000018e017._0_1_ = '.';
    uRam000000000018e017._1_1_ = '.';
    uRam000000000018e017._2_1_ = '.';
    uRam000000000018e017._3_1_ = '.';
    uRam000000000018e017._4_1_ = '.';
    uRam000000000018e017._5_1_ = '.';
    uRam000000000018e017._6_1_ = '.';
    uRam000000000018e017._7_1_ = '.';
    DAT_0018e000 = '.';
    DAT_0018e000_1._0_1_ = '.';
    DAT_0018e000_1._1_1_ = '.';
    DAT_0018e000_1._2_1_ = '.';
    DAT_0018e000_1._3_1_ = '.';
    DAT_0018e000_1._4_1_ = '.';
    DAT_0018e000_1._5_1_ = '.';
    DAT_0018e000_1._6_1_ = '.';
    uRam000000000018e008 = 0x2e2e2e2e2e2e2e;
    DAT_0018e00f = 0x2e;
    DAT_0018dff0 = '.';
    DAT_0018dff0_1._0_1_ = '.';
    DAT_0018dff0_1._1_1_ = '.';
    DAT_0018dff0_1._2_1_ = '.';
    DAT_0018dff0_1._3_1_ = '.';
    DAT_0018dff0_1._4_1_ = '.';
    DAT_0018dff0_1._5_1_ = '.';
    DAT_0018dff0_1._6_1_ = '.';
    uRam000000000018dff8._0_1_ = '.';
    uRam000000000018dff8._1_1_ = '.';
    uRam000000000018dff8._2_1_ = '.';
    uRam000000000018dff8._3_1_ = '.';
    uRam000000000018dff8._4_1_ = '.';
    uRam000000000018dff8._5_1_ = '.';
    uRam000000000018dff8._6_1_ = '.';
    uRam000000000018dff8._7_1_ = '.';
    DAT_0018dfe0 = '.';
    DAT_0018dfe0_1._0_1_ = '.';
    DAT_0018dfe0_1._1_1_ = '.';
    DAT_0018dfe0_1._2_1_ = '.';
    DAT_0018dfe0_1._3_1_ = '.';
    DAT_0018dfe0_1._4_1_ = '.';
    DAT_0018dfe0_1._5_1_ = '.';
    DAT_0018dfe0_1._6_1_ = '.';
    uRam000000000018dfe8._0_1_ = '.';
    uRam000000000018dfe8._1_1_ = '.';
    uRam000000000018dfe8._2_1_ = '.';
    uRam000000000018dfe8._3_1_ = '.';
    uRam000000000018dfe8._4_1_ = '.';
    uRam000000000018dfe8._5_1_ = '.';
    uRam000000000018dfe8._6_1_ = '.';
    uRam000000000018dfe8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000018dfd8._0_1_ = '.';
    uRam000000000018dfd8._1_1_ = '.';
    uRam000000000018dfd8._2_1_ = '.';
    uRam000000000018dfd8._3_1_ = '.';
    uRam000000000018dfd8._4_1_ = '.';
    uRam000000000018dfd8._5_1_ = '.';
    uRam000000000018dfd8._6_1_ = '.';
    uRam000000000018dfd8._7_1_ = '.';
    DAT_0018e01f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}